

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O1

cmValue __thiscall cmTarget::GetProperty(cmTarget *this,string *prop)

{
  size_t sVar1;
  string_view *psVar2;
  UsageRequirementProperty *__s1;
  UsageRequirementProperty *__n;
  _Head_base<0UL,_cmTargetInternals_*,_false> _Var3;
  size_t *psVar4;
  bool bVar5;
  __type _Var6;
  int iVar7;
  iterator iVar8;
  undefined1 *puVar9;
  cmState *this_00;
  undefined7 extraout_var;
  long *plVar10;
  long lVar11;
  size_type __rlen;
  bool bVar12;
  FileSetType *fileSetTypes [2];
  UsageRequirementProperty *usageRequirements [17];
  undefined1 local_439;
  undefined1 local_438 [16];
  undefined1 local_428 [32];
  undefined1 local_408 [16];
  undefined1 local_3f8 [16];
  UsageRequirementProperty *local_3e8;
  UsageRequirementProperty *local_3e0;
  undefined1 local_3d8 [32];
  undefined1 local_3b8 [16];
  UsageRequirementProperty *local_3a8;
  pointer local_3a0;
  undefined1 local_398 [16];
  UsageRequirementProperty *local_388;
  undefined1 local_378 [16];
  undefined1 *local_368;
  undefined1 local_358 [16];
  undefined1 *local_348 [2];
  undefined1 local_338 [16];
  _Hash_node_base *local_328 [2];
  _Hash_node_base local_318 [2];
  __node_base *local_308 [2];
  __node_base local_2f8 [2];
  undefined1 *local_2e8 [2];
  undefined1 local_2d8 [16];
  unsigned_long *local_2c8 [2];
  unsigned_long local_2b8 [2];
  unsigned_long *local_2a8 [2];
  unsigned_long local_298 [2];
  undefined1 *local_288 [2];
  undefined1 local_278 [16];
  undefined1 *local_268 [2];
  undefined1 local_258 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  undefined1 local_238 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  undefined1 local_218 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208;
  undefined1 local_1f8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  undefined1 local_1d8 [16];
  undefined1 *local_1c8 [2];
  undefined1 local_1b8 [16];
  long ****local_1a8 [2];
  long ***local_198 [2];
  Method *local_188 [2];
  Method local_178 [4];
  undefined1 *local_168 [2];
  undefined1 local_158 [16];
  undefined1 *local_148 [2];
  undefined1 local_138 [16];
  undefined1 *local_128 [2];
  undefined1 local_118 [16];
  undefined1 *local_108 [2];
  undefined1 local_f8 [16];
  undefined1 *local_e8 [2];
  undefined1 local_d8 [16];
  undefined1 *local_c8 [2];
  undefined1 local_b8 [16];
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  long *local_68 [2];
  long local_58 [2];
  cmStateSnapshot local_48;
  
  if ((GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_ == '\0') &&
     (iVar7 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_
                                 ), iVar7 != 0)) {
    local_408._0_8_ = local_408 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_408,(anonymous_namespace)::propC_STANDARD_abi_cxx11_,
               DAT_00c055b0 + (long)(anonymous_namespace)::propC_STANDARD_abi_cxx11_);
    local_3e8 = (UsageRequirementProperty *)local_3d8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_3e8,(anonymous_namespace)::propCXX_STANDARD_abi_cxx11_,
               DAT_00c055d0 + (long)(anonymous_namespace)::propCXX_STANDARD_abi_cxx11_);
    local_3d8._16_8_ = local_3b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_3d8 + 0x10),(anonymous_namespace)::propCUDA_STANDARD_abi_cxx11_,
               DAT_00c055f0 + (long)(anonymous_namespace)::propCUDA_STANDARD_abi_cxx11_);
    local_3a8 = (UsageRequirementProperty *)local_398;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_3a8,(anonymous_namespace)::propHIP_STANDARD_abi_cxx11_,
               DAT_00c05610 + (long)(anonymous_namespace)::propHIP_STANDARD_abi_cxx11_);
    local_388 = (UsageRequirementProperty *)local_378;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_388,(anonymous_namespace)::propOBJC_STANDARD_abi_cxx11_,
               DAT_00c05630 + (long)(anonymous_namespace)::propOBJC_STANDARD_abi_cxx11_);
    local_368 = local_358;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_368,(anonymous_namespace)::propOBJCXX_STANDARD_abi_cxx11_,
               DAT_00c05650 + (anonymous_namespace)::propOBJCXX_STANDARD_abi_cxx11_);
    local_348[0] = local_338;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_348,(anonymous_namespace)::propLINK_LIBRARIES_abi_cxx11_,
               DAT_00c058d0 + (anonymous_namespace)::propLINK_LIBRARIES_abi_cxx11_);
    local_328[0] = local_318;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_328,(anonymous_namespace)::propTYPE_abi_cxx11_,
               DAT_00c05950 + (anonymous_namespace)::propTYPE_abi_cxx11_);
    local_308[0] = local_2f8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_308,(anonymous_namespace)::propINCLUDE_DIRECTORIES_abi_cxx11_,
               DAT_00c057d0 + (anonymous_namespace)::propINCLUDE_DIRECTORIES_abi_cxx11_);
    local_2e8[0] = local_2d8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_2e8,(anonymous_namespace)::propCOMPILE_FEATURES_abi_cxx11_,
               DAT_00c05690 + (anonymous_namespace)::propCOMPILE_FEATURES_abi_cxx11_);
    local_2c8[0] = local_2b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_2c8,(anonymous_namespace)::propCOMPILE_OPTIONS_abi_cxx11_,
               DAT_00c056b0 + (anonymous_namespace)::propCOMPILE_OPTIONS_abi_cxx11_);
    local_2a8[0] = local_298;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_2a8,(anonymous_namespace)::propCOMPILE_DEFINITIONS_abi_cxx11_,
               DAT_00c05670 + (anonymous_namespace)::propCOMPILE_DEFINITIONS_abi_cxx11_);
    local_288[0] = local_278;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_288,(anonymous_namespace)::propPRECOMPILE_HEADERS_abi_cxx11_,
               DAT_00c056d0 + (anonymous_namespace)::propPRECOMPILE_HEADERS_abi_cxx11_);
    local_268[0] = local_258;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_268,(anonymous_namespace)::propLINK_OPTIONS_abi_cxx11_,
               DAT_00c057f0 + (anonymous_namespace)::propLINK_OPTIONS_abi_cxx11_);
    local_248._M_allocated_capacity = (size_type)local_238;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_248,(anonymous_namespace)::propLINK_DIRECTORIES_abi_cxx11_,
               DAT_00c058b0 + (anonymous_namespace)::propLINK_DIRECTORIES_abi_cxx11_);
    local_228._M_allocated_capacity = (size_type)local_218;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_228,(anonymous_namespace)::propIMPORTED_abi_cxx11_,
               DAT_00c05790 + (anonymous_namespace)::propIMPORTED_abi_cxx11_);
    local_208._M_allocated_capacity = (size_type)local_1f8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_208,(anonymous_namespace)::propIMPORTED_GLOBAL_abi_cxx11_,
               DAT_00c057b0 + (anonymous_namespace)::propIMPORTED_GLOBAL_abi_cxx11_);
    local_1e8._M_allocated_capacity = (size_type)local_1d8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1e8,
               (anonymous_namespace)::propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_,
               DAT_00c058f0 + (anonymous_namespace)::propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_);
    local_1c8[0] = local_1b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1c8,(anonymous_namespace)::propNAME_abi_cxx11_,
               DAT_00c05910 + (anonymous_namespace)::propNAME_abi_cxx11_);
    local_1a8[0] = (long ****)(local_1a8 + 2);
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1a8,(anonymous_namespace)::propBINARY_DIR_abi_cxx11_,
               DAT_00c05970 + (anonymous_namespace)::propBINARY_DIR_abi_cxx11_);
    local_188[0] = local_178;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_1a8 + 4),(anonymous_namespace)::propSOURCE_DIR_abi_cxx11_,
               DAT_00c05990 + (anonymous_namespace)::propSOURCE_DIR_abi_cxx11_);
    local_168[0] = local_158;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_168,(anonymous_namespace)::propSOURCES_abi_cxx11_,
               DAT_00c05930 + (anonymous_namespace)::propSOURCES_abi_cxx11_);
    local_148[0] = local_138;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_148,(anonymous_namespace)::propINTERFACE_LINK_LIBRARIES_abi_cxx11_,
               DAT_00c059f0 + (anonymous_namespace)::propINTERFACE_LINK_LIBRARIES_abi_cxx11_);
    local_128[0] = local_118;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_128,
               (anonymous_namespace)::propINTERFACE_LINK_LIBRARIES_DIRECT_abi_cxx11_,
               DAT_00c05a10 + (anonymous_namespace)::propINTERFACE_LINK_LIBRARIES_DIRECT_abi_cxx11_)
    ;
    local_108[0] = local_f8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_108,
               (anonymous_namespace)::propINTERFACE_LINK_LIBRARIES_DIRECT_EXCLUDE_abi_cxx11_,
               DAT_00c05a30 +
               (anonymous_namespace)::propINTERFACE_LINK_LIBRARIES_DIRECT_EXCLUDE_abi_cxx11_);
    local_e8[0] = local_d8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_e8,
               (anonymous_namespace)::propIMPORTED_CXX_MODULES_INCLUDE_DIRECTORIES_abi_cxx11_,
               DAT_00c05810 +
               (anonymous_namespace)::propIMPORTED_CXX_MODULES_INCLUDE_DIRECTORIES_abi_cxx11_);
    local_c8[0] = local_b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_c8,
               (anonymous_namespace)::propIMPORTED_CXX_MODULES_COMPILE_DEFINITIONS_abi_cxx11_,
               DAT_00c05830 +
               (anonymous_namespace)::propIMPORTED_CXX_MODULES_COMPILE_DEFINITIONS_abi_cxx11_);
    local_a8[0] = local_98;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_a8,
               (anonymous_namespace)::propIMPORTED_CXX_MODULES_COMPILE_FEATURES_abi_cxx11_,
               DAT_00c05850 +
               (anonymous_namespace)::propIMPORTED_CXX_MODULES_COMPILE_FEATURES_abi_cxx11_);
    local_88[0] = local_78;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_88,
               (anonymous_namespace)::propIMPORTED_CXX_MODULES_COMPILE_OPTIONS_abi_cxx11_,
               DAT_00c05870 +
               (anonymous_namespace)::propIMPORTED_CXX_MODULES_COMPILE_OPTIONS_abi_cxx11_);
    plVar10 = local_58;
    local_68[0] = plVar10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_68,
               (anonymous_namespace)::propIMPORTED_CXX_MODULES_LINK_LIBRARIES_abi_cxx11_,
               DAT_00c05890 +
               (anonymous_namespace)::propIMPORTED_CXX_MODULES_LINK_LIBRARIES_abi_cxx11_);
    std::
    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::_Hashtable<std::__cxx11::string_const*>
              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)&GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_,local_408,
               &local_48,0,local_438,&local_48,&local_439);
    lVar11 = -0x3c0;
    do {
      if (plVar10 != (long *)plVar10[-2]) {
        operator_delete((long *)plVar10[-2],*plVar10 + 1);
      }
      plVar10 = plVar10 + -4;
      lVar11 = lVar11 + 0x20;
    } while (lVar11 != 0);
    __cxa_atexit(std::
                 unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::~unordered_set,&GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_
                 ,&__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_);
  }
  local_428._24_8_ =
       std::
       _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
       ::find(&GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_._M_h,prop);
  if ((__node_type *)local_428._24_8_ == (__node_type *)0x0) goto LAB_003dd19f;
  sVar1 = prop->_M_string_length;
  if ((((((sVar1 == DAT_00c055b0) &&
         ((sVar1 == 0 ||
          (iVar7 = bcmp((prop->_M_dataplus)._M_p,(anonymous_namespace)::propC_STANDARD_abi_cxx11_,
                        sVar1), iVar7 == 0)))) ||
        ((sVar1 == DAT_00c055d0 &&
         ((sVar1 == 0 ||
          (iVar7 = bcmp((prop->_M_dataplus)._M_p,(anonymous_namespace)::propCXX_STANDARD_abi_cxx11_,
                        sVar1), iVar7 == 0)))))) ||
       ((sVar1 == DAT_00c055f0 &&
        ((sVar1 == 0 ||
         (iVar7 = bcmp((prop->_M_dataplus)._M_p,(anonymous_namespace)::propCUDA_STANDARD_abi_cxx11_,
                       sVar1), iVar7 == 0)))))) ||
      ((sVar1 == DAT_00c05610 &&
       ((sVar1 == 0 ||
        (iVar7 = bcmp((prop->_M_dataplus)._M_p,(anonymous_namespace)::propHIP_STANDARD_abi_cxx11_,
                      sVar1), iVar7 == 0)))))) ||
     (((sVar1 == DAT_00c05630 &&
       ((sVar1 == 0 ||
        (iVar7 = bcmp((prop->_M_dataplus)._M_p,(anonymous_namespace)::propOBJC_STANDARD_abi_cxx11_,
                      sVar1), iVar7 == 0)))) ||
      (_Var6 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&(anonymous_namespace)::propOBJCXX_STANDARD_abi_cxx11_),
      _Var6)))) {
    iVar8 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::find(&(((this->impl)._M_t.
                      super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                      .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                    LanguageStandardProperties)._M_t,prop);
    if (iVar8._M_node ==
        (_Base_ptr)
        ((long)&((this->impl)._M_t.
                 super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                 .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                LanguageStandardProperties + 8U)) {
      return (cmValue)(string *)0x0;
    }
    return (cmValue)(iVar8._M_node + 2);
  }
  _Var3._M_head_impl =
       (this->impl)._M_t.
       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
       super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
  local_408._0_8_ = &(_Var3._M_head_impl)->IncludeDirectories;
  local_408._8_8_ = &(_Var3._M_head_impl)->CompileOptions;
  local_3f8._0_8_ = &(_Var3._M_head_impl)->CompileFeatures;
  local_3f8._8_8_ = &(_Var3._M_head_impl)->CompileDefinitions;
  local_3e8 = &(_Var3._M_head_impl)->PrecompileHeaders;
  local_3e0 = &(_Var3._M_head_impl)->Sources;
  local_3d8._0_8_ = &(_Var3._M_head_impl)->LinkOptions;
  local_3d8._8_8_ = &(_Var3._M_head_impl)->LinkDirectories;
  local_3d8._16_8_ = &(_Var3._M_head_impl)->LinkLibraries;
  local_3d8._24_8_ = (pointer)&(_Var3._M_head_impl)->InterfaceLinkLibraries;
  local_3b8._0_8_ = (pointer)&(_Var3._M_head_impl)->InterfaceLinkLibrariesDirect;
  local_3b8._8_8_ = (pointer)&(_Var3._M_head_impl)->InterfaceLinkLibrariesDirectExclude;
  local_3a8 = &(_Var3._M_head_impl)->ImportedCxxModulesIncludeDirectories;
  local_3a0 = (pointer)&(_Var3._M_head_impl)->ImportedCxxModulesCompileDefinitions;
  local_398._0_8_ = (pointer)&(_Var3._M_head_impl)->ImportedCxxModulesCompileFeatures;
  local_398._8_8_ = (pointer)&(_Var3._M_head_impl)->ImportedCxxModulesCompileOptions;
  local_388 = &(_Var3._M_head_impl)->ImportedCxxModulesLinkLibraries;
  lVar11 = 0;
  do {
    psVar4 = *(size_t **)(local_408 + lVar11);
    sVar1 = prop->_M_string_length;
    if ((sVar1 == *psVar4) &&
       ((sVar1 == 0 || (iVar7 = bcmp((prop->_M_dataplus)._M_p,(void *)psVar4[1],sVar1), iVar7 == 0))
       )) {
      bVar12 = true;
      if (psVar4[3] == psVar4[4]) {
        local_428._24_8_ = (__node_type *)0x0;
      }
      else {
        if ((anonymous_namespace)::UsageRequirementProperty::Read(std::__cxx11::string_const&)::
            output_abi_cxx11_ == '\0') {
          GetProperty();
        }
        cmList::
        to_string<std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_0>
                  ((string *)local_438,
                   (vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)(psVar4 + 3));
        std::__cxx11::string::operator=
                  ((string *)
                   (anonymous_namespace)::UsageRequirementProperty::
                   Read(std::__cxx11::string_const&)::output_abi_cxx11_,(string *)local_438);
        if ((cmState *)local_438._0_8_ != (cmState *)(local_438 + 0x10)) {
          operator_delete((void *)local_438._0_8_,local_428._0_8_ + 1);
        }
        local_428._24_8_ =
             (anonymous_namespace)::UsageRequirementProperty::Read(std::__cxx11::string_const&)::
             output_abi_cxx11_;
      }
    }
    else {
      local_428._24_8_ = (__node_type *)0x0;
      bVar12 = false;
    }
    if (bVar12) {
      bVar12 = false;
      goto LAB_003dd944;
    }
    lVar11 = lVar11 + 8;
  } while (lVar11 != 0x88);
  _Var6 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &(anonymous_namespace)::propTYPE_abi_cxx11_);
  if (_Var6) {
    local_428._24_8_ =
         cmState::GetTargetTypeName_abi_cxx11_
                   (((this->impl)._M_t.
                     super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                     .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->TargetType);
LAB_003dd942:
    bVar12 = false;
  }
  else {
    _Var6 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&(anonymous_namespace)::
                                     propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_);
    if (!_Var6) {
      _Var6 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&(anonymous_namespace)::propIMPORTED_abi_cxx11_);
      if (_Var6) {
        bVar12 = cmTargetInternals::IsImported
                           ((this->impl)._M_t.
                            super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                            .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl);
      }
      else {
        _Var6 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&(anonymous_namespace)::propIMPORTED_GLOBAL_abi_cxx11_);
        if (!_Var6) {
          _Var6 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&(anonymous_namespace)::propNAME_abi_cxx11_);
          if (_Var6) {
            local_428._24_8_ =
                 &((this->impl)._M_t.
                   super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                   .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Name;
          }
          else {
            _Var6 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&(anonymous_namespace)::propBINARY_DIR_abi_cxx11_);
            if (_Var6) {
              cmMakefile::GetStateSnapshot
                        (((this->impl)._M_t.
                          super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                          .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile
                        );
              cmStateSnapshot::GetDirectory((cmStateDirectory *)local_438,&local_48);
              local_428._24_8_ =
                   cmStateDirectory::GetCurrentBinary_abi_cxx11_((cmStateDirectory *)local_438);
            }
            else {
              _Var6 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&(anonymous_namespace)::propSOURCE_DIR_abi_cxx11_);
              local_428._24_8_ = CONCAT71(extraout_var,_Var6);
              if (!_Var6) {
                bVar12 = true;
                goto LAB_003dd944;
              }
              cmMakefile::GetStateSnapshot
                        (((this->impl)._M_t.
                          super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                          .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile
                        );
              cmStateSnapshot::GetDirectory((cmStateDirectory *)local_438,&local_48);
              local_428._24_8_ =
                   cmStateDirectory::GetCurrentSource_abi_cxx11_((cmStateDirectory *)local_438);
            }
          }
          goto LAB_003dd942;
        }
        bVar12 = IsImportedGloballyVisible(this);
      }
      local_428._24_8_ = (anonymous_namespace)::propFALSE_abi_cxx11_;
      if (bVar12 != false) {
        local_428._24_8_ = (anonymous_namespace)::propTRUE_abi_cxx11_;
      }
      goto LAB_003dd942;
    }
    if (*(size_t *)
         ((long)&((this->impl)._M_t.
                  super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                  .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Utilities + 0x28
         ) == 0) {
      local_428._24_8_ = (__node_type *)0x0;
      goto LAB_003dd942;
    }
    if (GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_ == '\0') {
      GetProperty();
    }
    if (GetProperty(std::__cxx11::string_const&)::utilities_abi_cxx11_ == '\0') {
      GetProperty();
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::resize(&GetProperty(std::__cxx11::string_const&)::utilities_abi_cxx11_,
             *(size_t *)
              ((long)&((this->impl)._M_t.
                       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                       .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Utilities +
              0x28));
    _Var3._M_head_impl =
         (this->impl)._M_t.
         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
         super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
    std::
    transform<std::_Rb_tree_const_iterator<BT<std::pair<std::__cxx11::string,bool>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,cmTarget::GetProperty(std::__cxx11::string_const&)const::__0>
              (*(_Base_ptr *)((long)&(_Var3._M_head_impl)->Utilities + 0x18),
               (_Rb_tree_header *)((long)&(_Var3._M_head_impl)->Utilities + 8),
               GetProperty(std::__cxx11::string_const&)::utilities_abi_cxx11_.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    cmList::
    to_string<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
              ((string *)local_438,&GetProperty(std::__cxx11::string_const&)::utilities_abi_cxx11_);
    std::__cxx11::string::operator=
              ((string *)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,
               (string *)local_438);
    if ((cmState *)local_438._0_8_ != (cmState *)(local_438 + 0x10)) {
      operator_delete((void *)local_438._0_8_,local_428._0_8_ + 1);
    }
    bVar12 = false;
    local_428._24_8_ = &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_;
  }
LAB_003dd944:
  if (!bVar12) {
    return (cmValue)local_428._24_8_;
  }
LAB_003dd19f:
  _Var3._M_head_impl =
       (this->impl)._M_t.
       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
       super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
  local_438._0_8_ = (cmState *)&(_Var3._M_head_impl)->HeadersFileSets;
  local_438._8_8_ =
       (cmLinkedTree<cmStateDetail::SnapshotDataType> *)&(_Var3._M_head_impl)->CxxModulesFileSets;
  bVar12 = false;
  lVar11 = 0;
  do {
    psVar2 = *(string_view **)(local_438 + lVar11);
    _Var3._M_head_impl =
         (this->impl)._M_t.
         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
         super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
    __s1 = (UsageRequirementProperty *)(prop->_M_dataplus)._M_p;
    __n = (UsageRequirementProperty *)prop->_M_string_length;
    if ((__n == (UsageRequirementProperty *)psVar2[1]._M_len) &&
       ((__n == (UsageRequirementProperty *)0x0 ||
        (iVar7 = bcmp(__s1,psVar2[1]._M_str,(size_t)__n), iVar7 == 0)))) {
      local_408._0_8_ = local_408 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_408,psVar2->_M_str,psVar2->_M_str + psVar2->_M_len);
      puVar9 = (undefined1 *)
               cmTargetInternals::GetFileSetDirectories
                         (_Var3._M_head_impl,this,(string *)local_408,*psVar2);
LAB_003dd4ac:
      if ((undefined1 *)local_408._0_8_ != local_408 + 0x10) {
        operator_delete((void *)local_408._0_8_,(ulong)(local_3f8._0_8_ + 1));
      }
      bVar5 = true;
    }
    else {
      if ((__n == (UsageRequirementProperty *)psVar2[2]._M_len) &&
         ((__n == (UsageRequirementProperty *)0x0 ||
          (iVar7 = bcmp(__s1,psVar2[2]._M_str,(size_t)__n), iVar7 == 0)))) {
        local_408._0_8_ = local_408 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_408,psVar2->_M_str,psVar2->_M_str + psVar2->_M_len);
        puVar9 = (undefined1 *)
                 cmTargetInternals::GetFileSetPaths
                           (_Var3._M_head_impl,this,(string *)local_408,*psVar2);
        goto LAB_003dd4ac;
      }
      if ((__n == (UsageRequirementProperty *)psVar2[8]._M_len) &&
         ((__n == (UsageRequirementProperty *)0x0 ||
          (iVar7 = bcmp(__s1,psVar2[8]._M_str,(size_t)__n), iVar7 == 0)))) {
        if ((anonymous_namespace)::FileSetType::
            ReadProperties(cmTarget_const*,cmTargetInternals_const*,std::__cxx11::string_const&)::
            output_abi_cxx11_ == '\0') {
          GetProperty();
        }
        cmList::
        to_string<std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_0>
                  ((string *)local_408,
                   (vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)(psVar2 + 9));
        std::__cxx11::string::operator=
                  ((string *)
                   (anonymous_namespace)::FileSetType::
                   ReadProperties(cmTarget_const*,cmTargetInternals_const*,std::__cxx11::string_const&)
                   ::output_abi_cxx11_,(string *)local_408);
        if ((undefined1 *)local_408._0_8_ != local_408 + 0x10) {
          operator_delete((void *)local_408._0_8_,(ulong)(local_3f8._0_8_ + 1));
        }
        bVar5 = true;
        puVar9 = (anonymous_namespace)::FileSetType::
                 ReadProperties(cmTarget_const*,cmTargetInternals_const*,std::__cxx11::string_const&)
                 ::output_abi_cxx11_;
      }
      else {
        if ((__n != (UsageRequirementProperty *)psVar2[10]._M_str) ||
           ((__n != (UsageRequirementProperty *)0x0 &&
            (iVar7 = bcmp(__s1,(void *)psVar2[0xb]._M_len,(size_t)__n), iVar7 != 0)))) {
          local_408._0_8_ = __n;
          local_408._8_8_ = __s1;
          iVar7 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                            ((basic_string_view<char,_std::char_traits<char>_> *)local_408,0,
                             psVar2[3]._M_len,psVar2[3]);
          if (iVar7 == 0) {
            std::__cxx11::string::substr((ulong)local_408,(ulong)prop);
            if ((UsageRequirementProperty *)local_408._8_8_ == (UsageRequirementProperty *)0x0) {
LAB_003dd4e6:
              puVar9 = (undefined1 *)0x0;
            }
            else {
              puVar9 = (undefined1 *)
                       cmTargetInternals::GetFileSetDirectories
                                 (_Var3._M_head_impl,this,(string *)local_408,*psVar2);
            }
          }
          else {
            local_408._8_8_ = (prop->_M_dataplus)._M_p;
            local_408._0_8_ = prop->_M_string_length;
            puVar9 = (undefined1 *)0x0;
            iVar7 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                              ((basic_string_view<char,_std::char_traits<char>_> *)local_408,0,
                               psVar2[4]._M_len,psVar2[4]);
            bVar5 = false;
            if (iVar7 != 0) goto LAB_003dd4ca;
            std::__cxx11::string::substr((ulong)local_408,(ulong)prop);
            if ((UsageRequirementProperty *)local_408._8_8_ == (UsageRequirementProperty *)0x0)
            goto LAB_003dd4e6;
            puVar9 = (undefined1 *)
                     cmTargetInternals::GetFileSetPaths
                               (_Var3._M_head_impl,this,(string *)local_408,*psVar2);
          }
          goto LAB_003dd4ac;
        }
        if ((anonymous_namespace)::FileSetType::
            ReadProperties(cmTarget_const*,cmTargetInternals_const*,std::__cxx11::string_const&)::
            output_abi_cxx11_ == '\0') {
          GetProperty();
        }
        cmList::
        to_string<std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_0>
                  ((string *)local_408,
                   (vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&psVar2[0xb]._M_str);
        std::__cxx11::string::operator=
                  ((string *)
                   (anonymous_namespace)::FileSetType::
                   ReadProperties(cmTarget_const*,cmTargetInternals_const*,std::__cxx11::string_const&)
                   ::output_abi_cxx11_,(string *)local_408);
        if ((undefined1 *)local_408._0_8_ != local_408 + 0x10) {
          operator_delete((void *)local_408._0_8_,(ulong)(local_3f8._0_8_ + 1));
        }
        bVar5 = true;
        puVar9 = (anonymous_namespace)::FileSetType::
                 ReadProperties(cmTarget_const*,cmTargetInternals_const*,std::__cxx11::string_const&)
                 ::output_abi_cxx11_;
      }
    }
LAB_003dd4ca:
    if (bVar5) break;
    lVar11 = lVar11 + 8;
    bVar12 = lVar11 == 0x10;
    puVar9 = (undefined1 *)local_428._24_8_;
  } while (!bVar12);
  if ((bVar12) &&
     (puVar9 = (undefined1 *)
               cmPropertyMap::GetPropertyValue
                         (&((this->impl)._M_t.
                            super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                            .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                           Properties,prop), (string *)puVar9 == (string *)0x0)) {
    this_00 = cmMakefile::GetState
                        (((this->impl)._M_t.
                          super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                          .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile
                        );
    bVar12 = cmState::IsPropertyChained(this_00,prop,TARGET);
    if (bVar12) {
      cmMakefile::GetStateSnapshot
                (((this->impl)._M_t.
                  super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                  .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile);
      cmStateSnapshot::GetDirectory((cmStateDirectory *)local_408,(cmStateSnapshot *)local_438);
      puVar9 = (undefined1 *)cmStateDirectory::GetProperty((cmStateDirectory *)local_408,prop,true);
    }
    else {
      puVar9 = (undefined1 *)0x0;
    }
  }
  return (cmValue)puVar9;
}

Assistant:

cmValue cmTarget::GetProperty(const std::string& prop) const
{
  static std::unordered_set<std::string> const specialProps{
    propC_STANDARD,
    propCXX_STANDARD,
    propCUDA_STANDARD,
    propHIP_STANDARD,
    propOBJC_STANDARD,
    propOBJCXX_STANDARD,
    propLINK_LIBRARIES,
    propTYPE,
    propINCLUDE_DIRECTORIES,
    propCOMPILE_FEATURES,
    propCOMPILE_OPTIONS,
    propCOMPILE_DEFINITIONS,
    propPRECOMPILE_HEADERS,
    propLINK_OPTIONS,
    propLINK_DIRECTORIES,
    propIMPORTED,
    propIMPORTED_GLOBAL,
    propMANUALLY_ADDED_DEPENDENCIES,
    propNAME,
    propBINARY_DIR,
    propSOURCE_DIR,
    propSOURCES,
    propINTERFACE_LINK_LIBRARIES,
    propINTERFACE_LINK_LIBRARIES_DIRECT,
    propINTERFACE_LINK_LIBRARIES_DIRECT_EXCLUDE,
    propIMPORTED_CXX_MODULES_INCLUDE_DIRECTORIES,
    propIMPORTED_CXX_MODULES_COMPILE_DEFINITIONS,
    propIMPORTED_CXX_MODULES_COMPILE_FEATURES,
    propIMPORTED_CXX_MODULES_COMPILE_OPTIONS,
    propIMPORTED_CXX_MODULES_LINK_LIBRARIES,
  };
  if (specialProps.count(prop)) {
    if (prop == propC_STANDARD || prop == propCXX_STANDARD ||
        prop == propCUDA_STANDARD || prop == propHIP_STANDARD ||
        prop == propOBJC_STANDARD || prop == propOBJCXX_STANDARD) {
      auto propertyIter = this->impl->LanguageStandardProperties.find(prop);
      if (propertyIter == this->impl->LanguageStandardProperties.end()) {
        return nullptr;
      }
      return cmValue(propertyIter->second.Value);
    }

    UsageRequirementProperty const* usageRequirements[] = {
      &this->impl->IncludeDirectories,
      &this->impl->CompileOptions,
      &this->impl->CompileFeatures,
      &this->impl->CompileDefinitions,
      &this->impl->PrecompileHeaders,
      &this->impl->Sources,
      &this->impl->LinkOptions,
      &this->impl->LinkDirectories,
      &this->impl->LinkLibraries,
      &this->impl->InterfaceLinkLibraries,
      &this->impl->InterfaceLinkLibrariesDirect,
      &this->impl->InterfaceLinkLibrariesDirectExclude,
      &this->impl->ImportedCxxModulesIncludeDirectories,
      &this->impl->ImportedCxxModulesCompileDefinitions,
      &this->impl->ImportedCxxModulesCompileFeatures,
      &this->impl->ImportedCxxModulesCompileOptions,
      &this->impl->ImportedCxxModulesLinkLibraries,
    };

    for (auto const* usageRequirement : usageRequirements) {
      auto value = usageRequirement->Read(prop);
      if (value.first) {
        return value.second;
      }
    }

    // the type property returns what type the target is
    if (prop == propTYPE) {
      return cmValue(cmState::GetTargetTypeName(this->GetType()));
    }
    if (prop == propMANUALLY_ADDED_DEPENDENCIES) {
      if (this->impl->Utilities.empty()) {
        return nullptr;
      }

      static std::string output;
      static std::vector<std::string> utilities;
      utilities.resize(this->impl->Utilities.size());
      std::transform(
        this->impl->Utilities.cbegin(), this->impl->Utilities.cend(),
        utilities.begin(),
        [](const BT<std::pair<std::string, bool>>& item) -> std::string {
          return item.Value.first;
        });
      output = cmList::to_string(utilities);
      return cmValue(output);
    }
    if (prop == propIMPORTED) {
      return this->IsImported() ? cmValue(propTRUE) : cmValue(propFALSE);
    }
    if (prop == propIMPORTED_GLOBAL) {
      return this->IsImportedGloballyVisible() ? cmValue(propTRUE)
                                               : cmValue(propFALSE);
    }
    if (prop == propNAME) {
      return cmValue(this->GetName());
    }
    if (prop == propBINARY_DIR) {
      return cmValue(this->impl->Makefile->GetStateSnapshot()
                       .GetDirectory()
                       .GetCurrentBinary());
    }
    if (prop == propSOURCE_DIR) {
      return cmValue(this->impl->Makefile->GetStateSnapshot()
                       .GetDirectory()
                       .GetCurrentSource());
    }
  }

  // Check fileset properties.
  {
    FileSetType* fileSetTypes[] = {
      &this->impl->HeadersFileSets,
      &this->impl->CxxModulesFileSets,
    };

    for (auto* fileSetType : fileSetTypes) {
      auto value = fileSetType->ReadProperties(this, this->impl.get(), prop);
      if (value.first) {
        return value.second;
      }
    }
  }

  cmValue retVal = this->impl->Properties.GetPropertyValue(prop);
  if (!retVal) {
    const bool chain = this->impl->Makefile->GetState()->IsPropertyChained(
      prop, cmProperty::TARGET);
    if (chain) {
      return this->impl->Makefile->GetStateSnapshot()
        .GetDirectory()
        .GetProperty(prop, chain);
    }
    return nullptr;
  }
  return retVal;
}